

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TransformFeedback::DrawXFBStreamInstanced::check(DrawXFBStreamInstanced *this)

{
  ulong uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  ulong uVar3;
  allocator_type local_29;
  vector<float,_std::allocator<float>_> pixels;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  std::vector<float,_std::allocator<float>_>::vector(&pixels,0x10,&local_29);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1220))
            (0,0,4,4,0x1903,0x1406,
             pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1944);
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 0x10) break;
    uVar1 = uVar3 + 1;
  } while (ABS(pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3] + -1.0) <= 0.0625);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pixels.super__Vector_base<float,_std::allocator<float>_>);
  return 0xf < uVar3;
}

Assistant:

bool gl3cts::TransformFeedback::DrawXFBStreamInstanced::check()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Number of pixels. */
	const glw::GLuint number_of_pixels = s_view_size * s_view_size;

	/* Fetch framebuffer. */
	std::vector<glw::GLfloat> pixels(number_of_pixels);

	gl.readPixels(0, 0, s_view_size, s_view_size, GL_RED, GL_FLOAT, &pixels[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

	/* Check results. */
	for (glw::GLuint i = 0; i < number_of_pixels; ++i)
	{
		if (fabs(pixels[i] - 1.f) > 0.0625 /* precision, expected result == 1.0 */)
		{
			return false;
		}
	}

	return true;
}